

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

void __thiscall JsrtDebugManager::CallDebugEventCallback::AutoClear::~AutoClear(AutoClear *this)

{
  JsrtDebuggerObjectsManager *this_00;
  ArenaAllocator *allocator;
  JsrtDebugManager *this_01;
  
  this_01 = this->jsrtDebugManager;
  if (this_01->debuggerObjectsManager != (JsrtDebuggerObjectsManager *)0x0) {
    this_00 = GetDebuggerObjectsManager(this_01);
    JsrtDebuggerObjectsManager::ClearAll(this_00);
    this_01 = this->jsrtDebugManager;
  }
  if (this_01->stackFrames != (JsrtDebugStackFrames *)0x0) {
    allocator = GetDebugObjectArena(this_01);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsrtDebugStackFrames>
              (allocator,this->jsrtDebugManager->stackFrames);
    this_01 = this->jsrtDebugManager;
    this_01->stackFrames = (JsrtDebugStackFrames *)0x0;
  }
  this_01->threadContext->debugManager->dispatchHaltFrameAddress = (void *)0x0;
  this->jsrtDebugManager = (JsrtDebugManager *)0x0;
  return;
}

Assistant:

~AutoClear()
        {
            if (jsrtDebugManager->debuggerObjectsManager != nullptr)
            {
                jsrtDebugManager->GetDebuggerObjectsManager()->ClearAll();
            }

            if (jsrtDebugManager->stackFrames != nullptr)
            {
                Adelete(jsrtDebugManager->GetDebugObjectArena(), jsrtDebugManager->stackFrames);
                jsrtDebugManager->stackFrames = nullptr;
            }
            this->jsrtDebugManager->GetThreadContext()->GetDebugManager()->SetDispatchHaltFrameAddress(nullptr);
            this->jsrtDebugManager = nullptr;
        }